

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

void flatcc_emitter_reset(flatcc_emitter_t *E)

{
  flatcc_emitter_page_t *__ptr;
  bool bVar1;
  flatcc_emitter_page_t *p;
  flatcc_emitter_t *E_local;
  
  if (E->front != (flatcc_emitter_page_t *)0x0) {
    E->back = E->front;
    E->front_cursor = E->front->page + 0x5c0;
    E->back_cursor = E->front_cursor;
    E->front_left = 0x5c0;
    E->back_left = 0x5c0;
    E->front->page_offset = -(int)E->front_left;
    if (E->used_average == 0) {
      E->used_average = E->used;
    }
    E->used_average = (E->used_average * 3 >> 2) + (E->used >> 2);
    E->used = 0;
    while( true ) {
      bVar1 = false;
      if (E->used_average << 1 < E->capacity) {
        bVar1 = E->back->next != E->front;
      }
      if (!bVar1) break;
      __ptr = E->back->next;
      E->back->next = __ptr->next;
      __ptr->next->prev = E->back;
      free(__ptr);
      E->capacity = E->capacity - 0xb80;
    }
  }
  return;
}

Assistant:

void flatcc_emitter_reset(flatcc_emitter_t *E)
{
    flatcc_emitter_page_t *p = E->front;

    if (!E->front) {
        return;
    }
    E->back = E->front;
    E->front_cursor = E->front->page + FLATCC_EMITTER_PAGE_SIZE / 2;
    E->back_cursor = E->front_cursor;
    E->front_left = FLATCC_EMITTER_PAGE_SIZE / 2;
    E->back_left = FLATCC_EMITTER_PAGE_SIZE - FLATCC_EMITTER_PAGE_SIZE / 2;
    E->front->page_offset = -(flatbuffers_soffset_t)E->front_left;
    /* Heuristic to reduce peak allocation over time. */
    if (E->used_average == 0) {
        E->used_average = E->used;
    }
    E->used_average = E->used_average * 3 / 4 + E->used / 4;
    E->used = 0;
    while (E->used_average * 2 < E->capacity && E->back->next != E->front) {
        /* We deallocate the page after back since it is less likely to be hot in cache. */
        p = E->back->next;
        E->back->next = p->next;
        p->next->prev = E->back;
        FLATCC_EMITTER_FREE(p);
        E->capacity -= FLATCC_EMITTER_PAGE_SIZE;
    }
}